

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zeSamplerDestroy(ze_sampler_handle_t hSampler)

{
  _ze_sampler_handle_t *_key;
  key_type local_40;
  lock_guard<std::mutex> local_38;
  lock_guard<std::mutex> lock;
  ze_pfnSamplerDestroy_t pfnDestroy;
  dditable_t *dditable;
  ze_result_t result;
  ze_sampler_handle_t hSampler_local;
  
  lock._M_device = *(mutex_type **)(*(long *)(hSampler + 8) + 0x5d0);
  if (lock._M_device == (mutex_type *)0x0) {
    hSampler_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    std::lock_guard<std::mutex>::lock_guard(&local_38,(mutex_type *)(context + 0x1528));
    local_40 = (key_type)hSampler;
    std::
    unordered_map<object_t<_ze_sampler_handle_t_*>_*,__ze_sampler_handle_t_*,_std::hash<object_t<_ze_sampler_handle_t_*>_*>,_std::equal_to<object_t<_ze_sampler_handle_t_*>_*>,_std::allocator<std::pair<object_t<_ze_sampler_handle_t_*>_*const,__ze_sampler_handle_t_*>_>_>
    ::erase((unordered_map<object_t<_ze_sampler_handle_t_*>_*,__ze_sampler_handle_t_*,_std::hash<object_t<_ze_sampler_handle_t_*>_*>,_std::equal_to<object_t<_ze_sampler_handle_t_*>_*>,_std::allocator<std::pair<object_t<_ze_sampler_handle_t_*>_*const,__ze_sampler_handle_t_*>_>_>
             *)(context + 0x1588),&local_40);
    std::lock_guard<std::mutex>::~lock_guard(&local_38);
    _key = *(_ze_sampler_handle_t **)hSampler;
    hSampler_local._4_4_ = (*(code *)lock._M_device)(_key);
    if (hSampler_local._4_4_ == ZE_RESULT_SUCCESS) {
      singleton_factory_t<object_t<_ze_sampler_handle_t_*>,__ze_sampler_handle_t_*>::release
                ((singleton_factory_t<object_t<_ze_sampler_handle_t_*>,__ze_sampler_handle_t_*> *)
                 (context + 0x780),_key);
    }
  }
  return hSampler_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeSamplerDestroy(
        ze_sampler_handle_t hSampler                    ///< [in][release] handle of the sampler
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_sampler_object_t*>( hSampler )->dditable;
        auto pfnDestroy = dditable->ze.Sampler.pfnDestroy;
        if( nullptr == pfnDestroy )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // remove the handle from the kernel arugment map
        {
            std::lock_guard<std::mutex> lock(context->sampler_handle_map_lock);
            context->sampler_handle_map.erase(reinterpret_cast<ze_sampler_object_t*>(hSampler));
        }
        // convert loader handle to driver handle
        hSampler = reinterpret_cast<ze_sampler_object_t*>( hSampler )->handle;

        // forward to device-driver
        result = pfnDestroy( hSampler );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        // release loader handle
        context->ze_sampler_factory.release( hSampler );

        return result;
    }